

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

bool QFileSystemEngine::mkpath
               (QFileSystemEntry *entry,optional<QFlags<QFileDevice::Permission>_> permissions)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  int *piVar4;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  mode_t mode;
  QByteArray path;
  undefined4 in_stack_ffffffffffffff70;
  mode_t mVar5;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  mode_t mode_00;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  QFlagsStorage<QFileDevice::Permission> in_stack_ffffffffffffff9c;
  
  mode_00 = (mode_t)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QFileSystemEntry::nativeFilePath
            ((QFileSystemEntry *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  bVar2 = QByteArray::isEmpty((QByteArray *)0x17a6d9);
  if (bVar2) {
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    bVar3 = false;
  }
  else {
    bVar2 = qIsFilenameBroken((QByteArray *)0x17a733);
    if (bVar2) {
      piVar4 = __errno_location();
      *piVar4 = 0x16;
      bVar3 = false;
    }
    else {
      bVar2 = std::optional::operator_cast_to_bool
                        ((optional<QFlags<QFileDevice::Permission>_> *)0x17a791);
      if (bVar2) {
        std::optional<QFlags<QFileDevice::Permission>_>::operator*
                  ((optional<QFlags<QFileDevice::Permission>_> *)0x17a7a4);
        mVar5 = QtPrivate::toMode_t((Permissions)in_stack_ffffffffffffff9c.i);
      }
      else {
        mVar5 = 0x1ff;
      }
      removeTrailingSlashes((QByteArray *)CONCAT44(mVar5,in_stack_ffffffffffffff70));
      createDirectoryWithParents
                ((QByteArray *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),mode_00
                );
      bVar3 = QSystemError::ok((QSystemError *)&stack0xffffffffffffff8c);
    }
  }
  QByteArray::~QByteArray((QByteArray *)0x17a809);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool QFileSystemEngine::mkpath(const QFileSystemEntry &entry,
                              std::optional<QFile::Permissions> permissions)
{
    QByteArray path = entry.nativeFilePath();
    Q_CHECK_FILE_NAME(path, false);

    mode_t mode = permissions ? QtPrivate::toMode_t(*permissions) : 0777;
    return createDirectoryWithParents(removeTrailingSlashes(path), mode).ok();
}